

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>_>
     ::appendTo<QChar>(type *p,QChar **out)

{
  long lVar1;
  QString *pQVar2;
  char16_t *pcVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  
  lVar1 = (p->a).a.a.a.d.size;
  if (lVar1 != 0) {
    pcVar3 = (p->a).a.a.a.d.ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar3,lVar1 * 2);
  }
  *out = *out + lVar1;
  QVar4.m_data = *(p->a).a.a.b;
  QVar4.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar4,out);
  pQVar2 = (p->a).a.b;
  lVar1 = (pQVar2->d).size;
  if (lVar1 != 0) {
    pcVar3 = (pQVar2->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar3,lVar1 * 2);
  }
  *out = *out + lVar1;
  QVar5.m_data = *(p->a).b;
  QVar5.m_size = 1;
  QAbstractConcatenable::convertFromUtf8(QVar5,out);
  lVar1 = (p->b->d).size;
  if (lVar1 != 0) {
    pcVar3 = (p->b->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar3,lVar1 * 2);
  }
  *out = *out + lVar1;
  return;
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }